

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O0

void start_server(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined1 local_18 [8];
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x66,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,&server);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x68,"0 == uv_tcp_init(uv_default_loop(), &server)");
    abort();
  }
  iVar1 = uv_tcp_bind(&server,(sockaddr *)local_18,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x69,"0 == uv_tcp_bind(&server, (struct sockaddr*) &addr, 0)");
    abort();
  }
  iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-write-queue-order.c"
            ,0x6a,"0 == uv_listen((uv_stream_t*) &server, 128, connection_cb)");
    abort();
  }
  return;
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT(r == 0);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT(r == 0);
}